

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::detail::ContextState::finalizeTestCaseData(ContextState *this)

{
  bool bVar1;
  int iVar2;
  long in_RDI;
  double dVar3;
  bool ok_to_fail;
  double in_stack_ffffffffffffffa8;
  undefined5 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb5;
  byte bVar4;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 uVar5;
  Approx local_38;
  Approx local_20;
  
  dVar3 = Timer::getElapsedSeconds
                    ((Timer *)CONCAT17(in_stack_ffffffffffffffb7,
                                       CONCAT16(in_stack_ffffffffffffffb6,
                                                CONCAT15(in_stack_ffffffffffffffb5,
                                                         in_stack_ffffffffffffffb0))));
  *(double *)(in_RDI + 0xa8) = dVar3;
  iVar2 = MultiLaneAtomic::operator_cast_to_int((MultiLaneAtomic<int> *)0x121ec8);
  *(int *)(in_RDI + 0x98) = iVar2 + *(int *)(in_RDI + 0x98);
  iVar2 = MultiLaneAtomic::operator_cast_to_int((MultiLaneAtomic<int> *)0x121ee5);
  *(int *)(in_RDI + 0x9c) = iVar2 + *(int *)(in_RDI + 0x9c);
  iVar2 = MultiLaneAtomic::operator_cast_to_int((MultiLaneAtomic<int> *)0x121f02);
  *(int *)(in_RDI + 0xa0) = iVar2;
  iVar2 = MultiLaneAtomic::operator_cast_to_int((MultiLaneAtomic<int> *)0x121f19);
  *(int *)(in_RDI + 0xa4) = iVar2;
  if (*(int *)(in_RDI + 0xa4) != 0) {
    *(uint *)(in_RDI + 0xb0) = *(uint *)(in_RDI + 0xb0) | 1;
  }
  Approx::Approx((Approx *)
                 CONCAT17(in_stack_ffffffffffffffb7,
                          CONCAT16(in_stack_ffffffffffffffb6,
                                   CONCAT15(in_stack_ffffffffffffffb5,in_stack_ffffffffffffffb0))),
                 in_stack_ffffffffffffffa8);
  Approx::epsilon(&local_20,2.220446049250313e-16);
  bVar1 = doctest::operator!=((Approx *)
                              CONCAT17(in_stack_ffffffffffffffb7,
                                       CONCAT16(in_stack_ffffffffffffffb6,
                                                CONCAT15(in_stack_ffffffffffffffb5,
                                                         in_stack_ffffffffffffffb0))),
                              in_stack_ffffffffffffffa8);
  uVar5 = false;
  if (bVar1) {
    Approx::Approx((Approx *)
                   (ulong)CONCAT16(in_stack_ffffffffffffffb6,
                                   CONCAT15(in_stack_ffffffffffffffb5,in_stack_ffffffffffffffb0)),
                   in_stack_ffffffffffffffa8);
    Approx::epsilon(&local_38,2.220446049250313e-16);
    uVar5 = operator>((Approx *)
                      CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffffb6,
                                              CONCAT15(in_stack_ffffffffffffffb5,
                                                       in_stack_ffffffffffffffb0))),
                      in_stack_ffffffffffffffa8);
  }
  if ((bool)uVar5 != false) {
    *(uint *)(in_RDI + 0xb0) = *(uint *)(in_RDI + 0xb0) | 0x10;
  }
  if ((*(byte *)(*(long *)(in_RDI + 0x20) + 0x3c) & 1) == 0) {
    if ((*(int *)(in_RDI + 0xb0) == 0) || ((*(byte *)(*(long *)(in_RDI + 0x20) + 0x3b) & 1) == 0)) {
      if (0 < *(int *)(*(long *)(in_RDI + 0x20) + 0x40)) {
        if (*(int *)(in_RDI + 0xa4) == *(int *)(*(long *)(in_RDI + 0x20) + 0x40)) {
          *(uint *)(in_RDI + 0xb0) = *(uint *)(in_RDI + 0xb0) | 0x100;
        }
        else {
          *(uint *)(in_RDI + 0xb0) = *(uint *)(in_RDI + 0xb0) | 0x80;
        }
      }
    }
    else {
      *(uint *)(in_RDI + 0xb0) = *(uint *)(in_RDI + 0xb0) | 0x200;
    }
  }
  else if (*(int *)(in_RDI + 0xb0) == 0) {
    *(uint *)(in_RDI + 0xb0) = *(uint *)(in_RDI + 0xb0) | 0x20;
  }
  else {
    *(uint *)(in_RDI + 0xb0) = *(uint *)(in_RDI + 0xb0) | 0x40;
  }
  bVar1 = true;
  if (((*(uint *)(in_RDI + 0xb0) & 0x40) == 0) &&
     (bVar1 = true, (*(uint *)(in_RDI + 0xb0) & 0x200) == 0)) {
    bVar1 = (*(uint *)(in_RDI + 0xb0) & 0x100) != 0;
  }
  bVar4 = 0;
  if (*(int *)(in_RDI + 0xb0) != 0) {
    bVar4 = bVar1 ^ 0xff;
  }
  *(byte *)(in_RDI + 0xb4) = (bVar4 ^ 0xff) & 1;
  if ((*(byte *)(in_RDI + 0xb4) & 1) == 0) {
    *(int *)(in_RDI + 0x94) = *(int *)(in_RDI + 0x94) + 1;
  }
  return;
}

Assistant:

void finalizeTestCaseData() {
            seconds = timer.getElapsedSeconds();

            // update the non-atomic counters
            numAsserts += numAssertsCurrentTest_atomic;
            numAssertsFailed += numAssertsFailedCurrentTest_atomic;
            numAssertsCurrentTest       = numAssertsCurrentTest_atomic;
            numAssertsFailedCurrentTest = numAssertsFailedCurrentTest_atomic;

            if(numAssertsFailedCurrentTest)
                failure_flags |= TestCaseFailureReason::AssertFailure;

            if(Approx(currentTest->m_timeout).epsilon(DBL_EPSILON) != 0 &&
               Approx(seconds).epsilon(DBL_EPSILON) > currentTest->m_timeout)
                failure_flags |= TestCaseFailureReason::Timeout;

            if(currentTest->m_should_fail) {
                if(failure_flags) {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedAndDid;
                } else {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedButDidnt;
                }
            } else if(failure_flags && currentTest->m_may_fail) {
                failure_flags |= TestCaseFailureReason::CouldHaveFailedAndDid;
            } else if(currentTest->m_expected_failures > 0) {
                if(numAssertsFailedCurrentTest == currentTest->m_expected_failures) {
                    failure_flags |= TestCaseFailureReason::FailedExactlyNumTimes;
                } else {
                    failure_flags |= TestCaseFailureReason::DidntFailExactlyNumTimes;
                }
            }

            bool ok_to_fail = (TestCaseFailureReason::ShouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::CouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::FailedExactlyNumTimes & failure_flags);

            // if any subcase has failed - the whole test case has failed
            testCaseSuccess = !(failure_flags && !ok_to_fail);
            if(!testCaseSuccess)
                numTestCasesFailed++;
        }